

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

int nn_trie_subscribe(nn_trie *self,uint8_t *data,size_t size)

{
  uint16_t *puVar1;
  uint8_t *__src;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  nn_trie *pnVar5;
  nn_trie_node *pnVar6;
  long lVar7;
  nn_trie_node *pnVar8;
  undefined4 *puVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  byte *pbVar15;
  long lVar16;
  byte bVar17;
  int iVar18;
  
  pnVar6 = self->root;
  if (pnVar6 != (nn_trie_node *)0x0) {
LAB_001333b9:
    __src = pnVar6->prefix;
    bVar10 = pnVar6->prefix_len;
    uVar11 = 0;
    if (bVar10 != 0) {
      uVar13 = (ulong)(uint)bVar10;
      uVar11 = 0;
      do {
        if (size == uVar11) {
          uVar11 = size & 0xffffffff;
          goto LAB_001333f6;
        }
        if (__src[uVar11] != data[uVar11]) goto LAB_001333f6;
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
      pbVar15 = data + uVar13;
      lVar16 = size - uVar13;
LAB_0013340f:
      if (size == uVar13) goto LAB_001337d7;
      pnVar5 = (nn_trie *)nn_node_next(pnVar6,*pbVar15);
      if ((pnVar5 == (nn_trie *)0x0) || (pnVar6 = pnVar5->root, pnVar6 == (nn_trie_node *)0x0))
      goto LAB_001334b2;
      data = pbVar15 + 1;
      size = lVar16 - 1;
      self = pnVar5;
      goto LAB_001333b9;
    }
LAB_001333f6:
    uVar13 = (ulong)(int)uVar11;
    pbVar15 = data + uVar13;
    lVar16 = size - uVar13;
    if ((int)(uint)bVar10 <= (int)uVar11) goto LAB_0013340f;
    pnVar8 = (nn_trie_node *)nn_alloc_(0x20);
    self->root = pnVar8;
    pnVar8->refcount = 0;
    pnVar8->prefix_len = (byte)uVar11;
    pnVar8->type = '\x01';
    memcpy(pnVar8->prefix,__src,uVar13);
    (self->root->u).sparse.children[0] = pnVar6->prefix[uVar13];
    bVar10 = ~(byte)uVar11 + pnVar6->prefix_len;
    pnVar6->prefix_len = bVar10;
    memmove(__src,__src + uVar13 + 1,(ulong)bVar10);
    pnVar6 = nn_node_compact(pnVar6);
    *(nn_trie_node **)(self->root + 1) = pnVar6;
LAB_001334b2:
    if (size == uVar13) goto LAB_001337d7;
    pnVar6 = self->root;
    uVar11 = (ulong)pnVar6->type;
    if (uVar11 < 8) {
      pnVar6 = (nn_trie_node *)nn_realloc(pnVar6,uVar11 * 8 + 0x20);
      self->root = pnVar6;
      pnVar6->prefix[(ulong)pnVar6->type + 10] = *pbVar15;
      pnVar6 = self->root;
      bVar10 = pnVar6->type + 1;
      pnVar6->type = bVar10;
      self = (nn_trie *)(pnVar6->prefix + (ulong)bVar10 * 8 + 10);
      ((nn_trie_node *)self)->refcount = 0;
      ((nn_trie_node *)self)->type = '\0';
      ((nn_trie_node *)self)->prefix_len = '\0';
      ((nn_trie_node *)self)->prefix[0] = '\0';
      ((nn_trie_node *)self)->prefix[1] = '\0';
    }
    else {
      if (pnVar6->type != 9) {
        bVar10 = 0xff;
        uVar13 = 0;
        bVar17 = 0;
        do {
          bVar2 = pnVar6->prefix[uVar13 + 10];
          if (bVar2 <= bVar10) {
            bVar10 = bVar2;
          }
          if (bVar2 < bVar17) {
            bVar2 = bVar17;
          }
          bVar17 = bVar2;
          uVar13 = uVar13 + 1;
        } while (uVar11 != uVar13);
        bVar2 = *pbVar15;
        if (bVar2 <= bVar10) {
          bVar10 = bVar2;
        }
        if (bVar2 < bVar17) {
          bVar2 = bVar17;
        }
        lVar7 = (long)(int)((uint)bVar2 - (uint)bVar10);
        pnVar8 = (nn_trie_node *)nn_alloc_(lVar7 * 8 + 0x20);
        self->root = pnVar8;
        pnVar8->refcount = 0;
        bVar17 = pnVar6->prefix_len;
        pnVar8->prefix_len = bVar17;
        pnVar8->type = '\t';
        memcpy(pnVar8->prefix,pnVar6->prefix,(ulong)bVar17);
        (self->root->u).sparse.children[0] = bVar10;
        (self->root->u).sparse.children[1] = bVar2;
        (self->root->u).dense.nbr = pnVar6->type + 1;
        memset(self->root + 1,0,lVar7 * 8 + 8);
        bVar17 = pnVar6->type;
        if ((ulong)bVar17 != 0) {
          uVar11 = 0;
          do {
            *(undefined8 *)
             ((long)self->root +
             ((ulong)pnVar6->prefix[uVar11 + 10] - (ulong)(uint)bVar10) * 8 + 0x18) =
                 *(undefined8 *)(pnVar6[1].prefix + uVar11 * 8 + -6);
            uVar11 = uVar11 + 1;
          } while (bVar17 != uVar11);
        }
        self = (nn_trie *)nn_node_next(self->root,*pbVar15);
        data = pbVar15 + 1;
        size = lVar16 - 1;
        nn_free(pnVar6);
        goto LAB_00133724;
      }
      bVar10 = *pbVar15;
      bVar17 = (pnVar6->u).sparse.children[0];
      bVar2 = (pnVar6->u).sparse.children[1];
      if ((bVar10 < bVar17) || (bVar2 < bVar10)) {
        if (bVar10 <= bVar17) {
          bVar17 = bVar10;
        }
        if (bVar2 <= bVar10) {
          bVar2 = bVar10;
        }
        iVar18 = (uint)bVar2 - (uint)bVar17;
        pnVar6 = (nn_trie_node *)nn_realloc(pnVar6,(long)iVar18 * 8 + 0x20);
        self->root = pnVar6;
        bVar3 = (pnVar6->u).sparse.children[0];
        lVar12 = (ulong)(pnVar6->u).sparse.children[1] - (ulong)bVar3;
        lVar7 = lVar12 + 1;
        if (bVar3 == bVar17) {
          pnVar6 = (nn_trie_node *)(pnVar6->prefix + (long)(int)lVar7 * 8 + -6);
          lVar12 = (long)(iVar18 - (int)lVar12);
        }
        else {
          lVar12 = (long)(int)((uint)bVar3 - (uint)bVar17);
          memmove(pnVar6[1].prefix + lVar12 * 8 + -6,pnVar6 + 1,lVar7 * 8);
          pnVar6 = self->root;
        }
        memset(pnVar6 + 1,0,lVar12 << 3);
        (self->root->u).sparse.children[0] = bVar17;
        (self->root->u).sparse.children[1] = bVar2;
        pnVar6 = self->root;
      }
      puVar1 = &(pnVar6->u).dense.nbr;
      *puVar1 = *puVar1 + 1;
      self = (nn_trie *)
             ((long)self->root +
             ((ulong)bVar10 - (ulong)(self->root->u).sparse.children[0]) * 8 + 0x18);
    }
    data = pbVar15 + 1;
    size = lVar16 - 1;
  }
LAB_00133724:
  puVar9 = (undefined4 *)nn_alloc_((ulong)(10 < size) * 8 + 0x18);
  *self = (nn_trie)puVar9;
  *puVar9 = 0;
  *(bool *)(puVar9 + 1) = 10 < size;
  sVar14 = 10;
  if (size < 10) {
    sVar14 = size;
  }
  *(char *)((long)puVar9 + 5) = (char)sVar14;
  memcpy((void *)((long)puVar9 + 6),data,sVar14);
  while (10 < size) {
    uVar11 = (ulong)self->root->prefix_len;
    pbVar15 = data + uVar11;
    data = pbVar15 + 1;
    (self->root->u).sparse.children[0] = *pbVar15;
    pnVar6 = self->root;
    size = size + ~uVar11;
    puVar9 = (undefined4 *)nn_alloc_((ulong)(10 < size) * 8 + 0x18);
    *(undefined4 **)(pnVar6 + 1) = puVar9;
    *(bool *)(puVar9 + 1) = 10 < size;
    self = (nn_trie *)(pnVar6 + 1);
    *puVar9 = 0;
    sVar14 = 10;
    if (size < 10) {
      sVar14 = size;
    }
    *(char *)((long)puVar9 + 5) = (char)sVar14;
    memcpy((void *)((long)puVar9 + 6),data,sVar14);
  }
LAB_001337d7:
  uVar4 = self->root->refcount;
  self->root->refcount = uVar4 + 1;
  return (int)(uVar4 == 0);
}

Assistant:

int nn_trie_subscribe (struct nn_trie *self, const uint8_t *data, size_t size)
{
    int i;
    struct nn_trie_node **node;
    struct nn_trie_node **n;
    struct nn_trie_node *ch;
    struct nn_trie_node *old_node;
    int pos;
    uint8_t c;
    uint8_t c2;
    uint8_t new_min;
    uint8_t new_max;
    int old_children;
    int new_children;
    int inserted;
    int more_nodes;

    /*  Step 1 -- Traverse the trie. */

    node = &self->root;
    while (1) {

        /*  If there are no more nodes on the path, go to step 4. */
        if (!*node)
            goto step4;

        /*  Check whether prefix matches the new subscription. */
        pos = nn_node_check_prefix (*node, data, size);
        data += pos;
        size -= pos;

        /*  If only part of the prefix matches, go to step 2. */
        if (pos < (*node)->prefix_len)
            goto step2;

        /*  Even if whole prefix matches and there's no more data to match,
            go directly to step 5. */
        if (!size)
            goto step5;

        /*  Move to the next node. If it is not present, go to step 3. */
        n = nn_node_next (*node, *data);
        if (!n || !*n)
            goto step3;
        node = n;
        ++data;
        --size;
    }

    /*  Step 2 -- Split the prefix into two parts if required. */
step2:

    ch = *node;
    *node = nn_alloc (sizeof (struct nn_trie_node) +
        sizeof (struct nn_trie_node*), "trie node");
    assert (*node);
    (*node)->refcount = 0;
    (*node)->prefix_len = pos;
    (*node)->type = 1;
    memcpy ((*node)->prefix, ch->prefix, pos);
    (*node)->u.sparse.children [0] = ch->prefix [pos];
    ch->prefix_len -= (pos + 1);
    memmove (ch->prefix, ch->prefix + pos + 1, ch->prefix_len);
    ch = nn_node_compact (ch);
    *nn_node_child (*node, 0) = ch;

    /*  Step 3 -- Adjust the child array to accommodate the new character. */
step3:

    /*  If there are no more data in the subscription, there's nothing to
        adjust in the child array. Proceed directly to the step 5. */
    if (!size)
        goto step5;

    /*  If the new branch fits into sparse array... */
    if ((*node)->type < NN_TRIE_SPARSE_MAX) {
        *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
            ((*node)->type + 1) * sizeof (struct nn_trie_node*));
        assert (*node);
        (*node)->u.sparse.children [(*node)->type] = *data;
        ++(*node)->type;
        node = nn_node_child (*node, (*node)->type - 1);
        *node = NULL;
        ++data;
        --size;
        goto step4;
    }

    /*  If the node is already a dense array, resize it to fit the next
        character. */
    if ((*node)->type == NN_TRIE_DENSE_TYPE) {
        c = *data;
        if (c < (*node)->u.dense.min || c > (*node)->u.dense.max) {
            new_min = (*node)->u.dense.min < c ? (*node)->u.dense.min : c;
            new_max = (*node)->u.dense.max > c ? (*node)->u.dense.max : c;
            *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
                (new_max - new_min + 1) * sizeof (struct nn_trie_node*));
            assert (*node);
            old_children = (*node)->u.dense.max - (*node)->u.dense.min + 1;
            new_children = new_max - new_min + 1;
            if ((*node)->u.dense.min != new_min) {
                inserted = (*node)->u.dense.min - new_min;
                memmove (nn_node_child (*node, inserted),
                    nn_node_child (*node, 0),
                    old_children * sizeof (struct nn_trie_node*));
                memset (nn_node_child (*node, 0), 0,
                    inserted * sizeof (struct nn_trie_node*));
            }
            else {
                memset (nn_node_child (*node, old_children), 0,
                    (new_children - old_children) *
                    sizeof (struct nn_trie_node*));
            }
            (*node)->u.dense.min = new_min;
            (*node)->u.dense.max = new_max;
        }
        ++(*node)->u.dense.nbr;

        node = nn_node_child (*node, c - (*node)->u.dense.min);
        ++data;
        --size;
        goto step4;
    }

    /*  This is a sparse array, but no more children can be added to it.
        We have to convert it into a dense array. */
    {
        /*  First, determine the range of children. */
        new_min = 255;
        new_max = 0;
        for (i = 0; i != (*node)->type; ++i) {
            c2 = (*node)->u.sparse.children [i];
            new_min = new_min < c2 ? new_min : c2;
            new_max = new_max > c2 ? new_max : c2;
        }
        new_min = new_min < *data ? new_min : *data;
        new_max = new_max > *data ? new_max : *data;

        /*  Create a new mode, while keeping the old one for a while. */
        old_node = *node;
        *node = (struct nn_trie_node*) nn_alloc (sizeof (struct nn_trie_node) +
            (new_max - new_min + 1) * sizeof (struct nn_trie_node*),
            "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->prefix_len = old_node->prefix_len;
        (*node)->type = NN_TRIE_DENSE_TYPE;
        memcpy ((*node)->prefix, old_node->prefix, old_node->prefix_len);
        (*node)->u.dense.min = new_min;
        (*node)->u.dense.max = new_max;
        (*node)->u.dense.nbr = old_node->type + 1;
        memset (*node + 1, 0, (new_max - new_min + 1) *
            sizeof (struct nn_trie_node*));
        for (i = 0; i != old_node->type; ++i)
            *nn_node_child (*node, old_node->u.sparse.children [i] - new_min) =
                *nn_node_child (old_node, i);
        node = nn_node_next (*node, *data);
        ++data;
        --size;

        /*  Get rid of the obsolete old node. */
        nn_free (old_node);
    }

    /*  Step 4 -- Create new nodes for remaining part of the subscription. */
step4:

    assert (!*node);
    while (1) {

        /*  Create a new node to hold the next part of the subscription. */
        more_nodes = size > NN_TRIE_PREFIX_MAX;
        *node = nn_alloc (sizeof (struct nn_trie_node) +
            (more_nodes ? sizeof (struct nn_trie_node*) : 0), "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->type = more_nodes ? 1 : 0;
        (*node)->prefix_len = size < (uint8_t) NN_TRIE_PREFIX_MAX ?
            (uint8_t) size : (uint8_t) NN_TRIE_PREFIX_MAX;
        memcpy ((*node)->prefix, data, (*node)->prefix_len);
        data += (*node)->prefix_len;
        size -= (*node)->prefix_len;
        if (!more_nodes)
            break;
        (*node)->u.sparse.children [0] = *data;
        node = nn_node_child (*node, 0);
        ++data;
        --size;
    }

    /*  Step 5 -- Create the subscription as such. */
step5:

    ++(*node)->refcount;

    /*  Return 1 in case of a fresh subscription. */
    return (*node)->refcount == 1 ? 1 : 0;
}